

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_sig(uchar **p,uchar *end,mbedtls_x509_buf *sig)

{
  byte bVar1;
  int iVar2;
  byte *local_28;
  size_t len;
  
  local_28 = *p;
  if (end != local_28 && -1 < (long)end - (long)local_28) {
    bVar1 = *local_28;
    iVar2 = mbedtls_asn1_get_bitstring_null(p,end,(size_t *)&local_28);
    if (iVar2 == 0) {
      sig->tag = (uint)bVar1;
      sig->len = (size_t)local_28;
      sig->p = *p;
      *p = *p + (long)local_28;
      iVar2 = 0;
    }
    else {
      iVar2 = iVar2 + -0x2480;
    }
    return iVar2;
  }
  return -0x24e0;
}

Assistant:

int mbedtls_x509_get_sig(unsigned char **p, const unsigned char *end, mbedtls_x509_buf *sig)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    int tag_type;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_SIGNATURE,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    tag_type = **p;

    if ((ret = mbedtls_asn1_get_bitstring_null(p, end, &len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_SIGNATURE, ret);
    }

    sig->tag = tag_type;
    sig->len = len;
    sig->p = *p;

    *p += len;

    return 0;
}